

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cc
# Opt level: O2

char flow::signatureType(LiteralType t)

{
  if ((t < (CidrArray|Boolean)) && ((0x1fefU >> (t & 0x1f) & 1) != 0)) {
    return (&DAT_00172c98)[t];
  }
  abort();
}

Assistant:

char signatureType(LiteralType t) {
  switch (t) {
    case LiteralType::Void:
      return 'V';
    case LiteralType::Boolean:
      return 'B';
    case LiteralType::Number:
      return 'I';
    case LiteralType::String:
      return 'S';
    case LiteralType::IPAddress:
      return 'P';
    case LiteralType::Cidr:
      return 'C';
    case LiteralType::RegExp:
      return 'R';
    case LiteralType::Handler:
      return 'H';
    case LiteralType::StringArray:
      return 's';
    case LiteralType::IntArray:
      return 'i';
    case LiteralType::IPAddrArray:
      return 'p';
    case LiteralType::CidrArray:
      return 'c';
    default:
      abort();
      return '?';
  }
}